

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlAssignRandom(Ssw_Sml_t *p,Aig_Obj_t *pObj)

{
  long lVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x205,"void Ssw_SmlAssignRandom(Ssw_Sml_t *, Aig_Obj_t *)");
  }
  iVar4 = p->nWordsTotal;
  lVar1 = (long)(pObj->Id * iVar4) * 4;
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      uVar3 = Aig_ManRandom(0);
      *(uint *)((long)&p[1].pAig + lVar5 * 4 + lVar1) = uVar3;
      lVar5 = lVar5 + 1;
      iVar4 = p->nWordsTotal;
    } while (lVar5 < iVar4);
  }
  if (p->nWordsFrame * p->nFrames == iVar4) {
    if (0 < p->nFrames) {
      iVar4 = 0;
      do {
        piVar2 = (int *)((long)&p[1].pAig + (long)p->nWordsFrame * (long)iVar4 * 4 + lVar1);
        *piVar2 = *piVar2 << 1;
        iVar4 = iVar4 + 1;
      } while (iVar4 < p->nFrames);
    }
    return;
  }
  __assert_fail("p->nWordsFrame * p->nFrames == p->nWordsTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                ,0x20a,"void Ssw_SmlAssignRandom(Ssw_Sml_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_SmlAssignRandom( Ssw_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i, f;
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id );
    for ( i = 0; i < p->nWordsTotal; i++ )
        pSims[i] = Ssw_ObjRandomSim();
    // set the first bit 0 in each frame
    assert( p->nWordsFrame * p->nFrames == p->nWordsTotal );
    for ( f = 0; f < p->nFrames; f++ )
        pSims[p->nWordsFrame*f] <<= 1;
}